

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUtil.c
# Opt level: O2

void Abc_SclSclGates2MioGates(SC_Lib *pLib,Abc_Ntk_t *p)

{
  int iVar1;
  Abc_Obj_t *pObj;
  undefined8 *puVar2;
  Mio_Gate_t *pMVar3;
  uint uVar4;
  char *__assertion;
  int i;
  uint uVar5;
  
  if (p->vGates == (Vec_Int_t *)0x0) {
    __assertion = "p->vGates != NULL";
    uVar4 = 0x4b;
LAB_003c325e:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUtil.c"
                  ,uVar4,"void Abc_SclSclGates2MioGates(SC_Lib *, Abc_Ntk_t *)");
  }
  i = 0;
  uVar4 = 0;
  uVar5 = 0;
  do {
    if (p->vObjs->nSize <= i) {
      if (uVar4 != 0) {
        printf("Could not find %d (out of %d) gates in the current library.\n",(ulong)uVar4,
               (ulong)uVar5);
      }
      Vec_IntFreeP(&p->vGates);
      p->pSCLib = (void *)0x0;
      return;
    }
    pObj = Abc_NtkObj(p,i);
    if (((pObj != (Abc_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x14 & 0xf) == 7)) &&
       ((pObj->vFanins).nSize != 0)) {
      iVar1 = Abc_ObjIsBarBuf(pObj);
      if (iVar1 == 0) {
        iVar1 = Vec_IntEntry(pObj->pNtk->vGates,pObj->Id);
        if (iVar1 == -1) {
          puVar2 = (undefined8 *)0x0;
        }
        else {
          puVar2 = (undefined8 *)Vec_PtrEntry((Vec_Ptr_t *)((long)pObj->pNtk->pSCLib + 0x60),iVar1);
        }
        if (*(int *)(puVar2 + 8) != (pObj->vFanins).nSize) {
          __assertion = "pCell->n_inputs == Abc_ObjFaninNum(pObj)";
          uVar4 = 0x4f;
          goto LAB_003c325e;
        }
        pMVar3 = Mio_LibraryReadGateByName((Mio_Library_t *)p->pManFunc,(char *)*puVar2,(char *)0x0)
        ;
        (pObj->field_5).pData = pMVar3;
        if ((pObj->field_0x14 & 0x30) != 0) {
          __assertion = "pObj->fMarkA == 0 && pObj->fMarkB == 0";
          uVar4 = 0x52;
          goto LAB_003c325e;
        }
        uVar4 = uVar4 + (pMVar3 == (Mio_Gate_t *)0x0);
        uVar5 = uVar5 + 1;
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

void Abc_SclSclGates2MioGates( SC_Lib * pLib, Abc_Ntk_t * p )
{
    Abc_Obj_t * pObj;
    SC_Cell * pCell;
    int i, Counter = 0, CounterAll = 0;
    assert( p->vGates != NULL );
    Abc_NtkForEachNodeNotBarBuf1( p, pObj, i )
    {
        pCell = Abc_SclObjCell(pObj);
        assert( pCell->n_inputs == Abc_ObjFaninNum(pObj) );
        pObj->pData = Mio_LibraryReadGateByName( (Mio_Library_t *)p->pManFunc, pCell->pName, NULL );
        Counter += (pObj->pData == NULL);
        assert( pObj->fMarkA == 0 && pObj->fMarkB == 0 );
        CounterAll++;
    }
    if ( Counter )
        printf( "Could not find %d (out of %d) gates in the current library.\n", Counter, CounterAll );
    Vec_IntFreeP( &p->vGates );
    p->pSCLib = NULL;
}